

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QLatin1StringView propertyNameForStandardPixmap(StandardPixmap sp)

{
  qsizetype qVar1;
  char *pcVar2;
  QLatin1StringView QVar3;
  QLatin1StringView QVar4;
  QLatin1StringView QVar5;
  qsizetype qStack_8;
  
  pcVar2 = "titlebar-menu-icon";
  qVar1 = 0x12;
  switch(sp) {
  case SP_TitleBarMinButton:
    pcVar2 = "titlebar-minimize-icon";
    goto LAB_0034f28b;
  case SP_TitleBarMaxButton:
    pcVar2 = "titlebar-maximize-icon";
LAB_0034f28b:
    qStack_8 = 0x16;
    break;
  case SP_TitleBarCloseButton:
    pcVar2 = "titlebar-close-icon";
    goto LAB_0034f348;
  case SP_TitleBarNormalButton:
    pcVar2 = "titlebar-normal-icon";
    qStack_8 = 0x14;
    break;
  case SP_TitleBarShadeButton:
    pcVar2 = "titlebar-shade-icon";
    goto LAB_0034f348;
  case SP_TitleBarUnshadeButton:
    pcVar2 = "titlebar-unshade-icon";
    goto LAB_0034f353;
  case SP_TitleBarContextHelpButton:
    pcVar2 = "titlebar-contexthelp-icon";
    qStack_8 = 0x19;
    break;
  case SP_DockWidgetCloseButton:
    pcVar2 = "dockwidget-close-icon";
    goto LAB_0034f353;
  case SP_MessageBoxInformation:
    pcVar2 = "messagebox-information-icon";
    qStack_8 = 0x1b;
    break;
  case SP_MessageBoxWarning:
    pcVar2 = "messagebox-warning-icon";
    qStack_8 = 0x17;
    break;
  case SP_MessageBoxCritical:
    pcVar2 = "messagebox-critical-icon";
    goto LAB_0034f317;
  case SP_MessageBoxQuestion:
    pcVar2 = "messagebox-question-icon";
    goto LAB_0034f317;
  case SP_DesktopIcon:
    pcVar2 = "desktop-icon";
    goto LAB_0034f37d;
  case SP_TrashIcon:
    pcVar2 = "trash-icon";
    qStack_8 = 10;
    break;
  case SP_ComputerIcon:
    pcVar2 = "computer-icon";
    goto LAB_0034f393;
  case SP_DriveFDIcon:
    pcVar2 = "floppy-icon";
    qStack_8 = 0xb;
    break;
  case SP_DriveHDIcon:
    pcVar2 = "harddisk-icon";
    goto LAB_0034f393;
  case SP_DriveCDIcon:
    pcVar2 = "cd-icon";
    qStack_8 = 7;
    break;
  case SP_DriveDVDIcon:
    pcVar2 = "dvd-icon";
    qStack_8 = 8;
    break;
  case SP_DriveNetIcon:
    pcVar2 = "network-icon";
    goto LAB_0034f37d;
  case SP_DirOpenIcon:
    pcVar2 = "directory-open-icon";
    goto LAB_0034f348;
  case SP_DirClosedIcon:
    pcVar2 = "directory-closed-icon";
    goto LAB_0034f353;
  case SP_DirLinkIcon:
    pcVar2 = "directory-link-icon";
    goto LAB_0034f348;
  default:
    pcVar2 = "";
    qVar1 = 0;
  case SP_TitleBarMenuButton:
    QVar3.m_data = pcVar2;
    QVar3.m_size = qVar1;
    return QVar3;
  case SP_FileIcon:
    pcVar2 = "file-icon";
    goto LAB_0034f233;
  case SP_FileLinkIcon:
    pcVar2 = "file-link-icon";
    goto LAB_0034f367;
  case SP_FileDialogStart:
    pcVar2 = "filedialog-start-icon";
LAB_0034f353:
    qStack_8 = 0x15;
    break;
  case SP_FileDialogEnd:
    pcVar2 = "filedialog-end-icon";
    goto LAB_0034f348;
  case SP_FileDialogToParent:
    pcVar2 = "filedialog-parent-directory-icon";
    qStack_8 = 0x20;
    break;
  case SP_FileDialogNewFolder:
    pcVar2 = "filedialog-new-directory-icon";
    qStack_8 = 0x1d;
    break;
  case SP_FileDialogDetailedView:
    pcVar2 = "filedialog-detailedview-icon";
    goto LAB_0034f372;
  case SP_FileDialogInfoView:
    pcVar2 = "filedialog-infoview-icon";
    goto LAB_0034f317;
  case SP_FileDialogContentsView:
    pcVar2 = "filedialog-contentsview-icon";
LAB_0034f372:
    qStack_8 = 0x1c;
    break;
  case SP_FileDialogListView:
    pcVar2 = "filedialog-listview-icon";
    goto LAB_0034f317;
  case SP_FileDialogBack:
    pcVar2 = "filedialog-backward-icon";
LAB_0034f317:
    qStack_8 = 0x18;
    break;
  case SP_DirIcon:
    pcVar2 = "directory-icon";
    goto LAB_0034f367;
  case SP_DialogOkButton:
    pcVar2 = "dialog-ok-icon";
    goto LAB_0034f367;
  case SP_DialogCancelButton:
    QVar4.m_data = "dialog-cancel-icon";
    QVar4.m_size = 0x12;
    return QVar4;
  case SP_DialogHelpButton:
    pcVar2 = "dialog-help-icon";
    goto LAB_0034f1c9;
  case SP_DialogOpenButton:
    pcVar2 = "dialog-open-icon";
    goto LAB_0034f1c9;
  case SP_DialogSaveButton:
    pcVar2 = "dialog-save-icon";
LAB_0034f1c9:
    qStack_8 = 0x10;
    break;
  case SP_DialogCloseButton:
    pcVar2 = "dialog-close-icon";
    goto LAB_0034f388;
  case SP_DialogApplyButton:
    pcVar2 = "dialog-apply-icon";
    goto LAB_0034f388;
  case SP_DialogResetButton:
    pcVar2 = "dialog-reset-icon";
LAB_0034f388:
    qStack_8 = 0x11;
    break;
  case SP_DialogDiscardButton:
    pcVar2 = "dialog-discard-icon";
LAB_0034f348:
    qStack_8 = 0x13;
    break;
  case SP_DialogYesButton:
    pcVar2 = "dialog-yes-icon";
    goto LAB_0034f2a5;
  case SP_DialogNoButton:
    pcVar2 = "dialog-no-icon";
    goto LAB_0034f367;
  case SP_ArrowUp:
    pcVar2 = "uparrow-icon";
    goto LAB_0034f37d;
  case SP_ArrowDown:
    pcVar2 = "downarrow-icon";
    goto LAB_0034f367;
  case SP_ArrowLeft:
    pcVar2 = "leftarrow-icon";
LAB_0034f367:
    qStack_8 = 0xe;
    break;
  case SP_ArrowRight:
    pcVar2 = "rightarrow-icon";
LAB_0034f2a5:
    qStack_8 = 0xf;
    break;
  case SP_ArrowBack:
    pcVar2 = "backward-icon";
LAB_0034f393:
    qStack_8 = 0xd;
    break;
  case SP_ArrowForward:
    pcVar2 = "forward-icon";
LAB_0034f37d:
    qStack_8 = 0xc;
    break;
  case SP_DirHomeIcon:
    pcVar2 = "home-icon";
LAB_0034f233:
    qStack_8 = 9;
    break;
  case SP_LineEditClearButton:
    pcVar2 = "lineedit-clear-button-icon";
    qStack_8 = 0x1a;
  }
  QVar5.m_data = pcVar2;
  QVar5.m_size = qStack_8;
  return QVar5;
}

Assistant:

static QLatin1StringView propertyNameForStandardPixmap(QStyle::StandardPixmap sp)
{
    switch (sp) {
        case QStyle::SP_TitleBarMenuButton: return "titlebar-menu-icon"_L1;
        case QStyle::SP_TitleBarMinButton: return "titlebar-minimize-icon"_L1;
        case QStyle::SP_TitleBarMaxButton: return "titlebar-maximize-icon"_L1;
        case QStyle::SP_TitleBarCloseButton: return "titlebar-close-icon"_L1;
        case QStyle::SP_TitleBarNormalButton: return "titlebar-normal-icon"_L1;
        case QStyle::SP_TitleBarShadeButton: return "titlebar-shade-icon"_L1;
        case QStyle::SP_TitleBarUnshadeButton: return "titlebar-unshade-icon"_L1;
        case QStyle::SP_TitleBarContextHelpButton: return "titlebar-contexthelp-icon"_L1;
        case QStyle::SP_DockWidgetCloseButton: return "dockwidget-close-icon"_L1;
        case QStyle::SP_MessageBoxInformation: return "messagebox-information-icon"_L1;
        case QStyle::SP_MessageBoxWarning: return "messagebox-warning-icon"_L1;
        case QStyle::SP_MessageBoxCritical: return "messagebox-critical-icon"_L1;
        case QStyle::SP_MessageBoxQuestion: return "messagebox-question-icon"_L1;
        case QStyle::SP_DesktopIcon: return "desktop-icon"_L1;
        case QStyle::SP_TrashIcon: return "trash-icon"_L1;
        case QStyle::SP_ComputerIcon: return "computer-icon"_L1;
        case QStyle::SP_DriveFDIcon: return "floppy-icon"_L1;
        case QStyle::SP_DriveHDIcon: return "harddisk-icon"_L1;
        case QStyle::SP_DriveCDIcon: return "cd-icon"_L1;
        case QStyle::SP_DriveDVDIcon: return "dvd-icon"_L1;
        case QStyle::SP_DriveNetIcon: return "network-icon"_L1;
        case QStyle::SP_DirOpenIcon: return "directory-open-icon"_L1;
        case QStyle::SP_DirClosedIcon: return "directory-closed-icon"_L1;
        case QStyle::SP_DirLinkIcon: return "directory-link-icon"_L1;
        case QStyle::SP_FileIcon: return "file-icon"_L1;
        case QStyle::SP_FileLinkIcon: return "file-link-icon"_L1;
        case QStyle::SP_FileDialogStart: return "filedialog-start-icon"_L1;
        case QStyle::SP_FileDialogEnd: return "filedialog-end-icon"_L1;
        case QStyle::SP_FileDialogToParent: return "filedialog-parent-directory-icon"_L1;
        case QStyle::SP_FileDialogNewFolder: return "filedialog-new-directory-icon"_L1;
        case QStyle::SP_FileDialogDetailedView: return "filedialog-detailedview-icon"_L1;
        case QStyle::SP_FileDialogInfoView: return "filedialog-infoview-icon"_L1;
        case QStyle::SP_FileDialogContentsView: return "filedialog-contentsview-icon"_L1;
        case QStyle::SP_FileDialogListView: return "filedialog-listview-icon"_L1;
        case QStyle::SP_FileDialogBack: return "filedialog-backward-icon"_L1;
        case QStyle::SP_DirIcon: return "directory-icon"_L1;
        case QStyle::SP_DialogOkButton: return "dialog-ok-icon"_L1;
        case QStyle::SP_DialogCancelButton: return "dialog-cancel-icon"_L1;
        case QStyle::SP_DialogHelpButton: return "dialog-help-icon"_L1;
        case QStyle::SP_DialogOpenButton: return "dialog-open-icon"_L1;
        case QStyle::SP_DialogSaveButton: return "dialog-save-icon"_L1;
        case QStyle::SP_DialogCloseButton: return "dialog-close-icon"_L1;
        case QStyle::SP_DialogApplyButton: return "dialog-apply-icon"_L1;
        case QStyle::SP_DialogResetButton: return "dialog-reset-icon"_L1;
        case QStyle::SP_DialogDiscardButton: return "dialog-discard-icon"_L1;
        case QStyle::SP_DialogYesButton: return "dialog-yes-icon"_L1;
        case QStyle::SP_DialogNoButton: return "dialog-no-icon"_L1;
        case QStyle::SP_ArrowUp: return "uparrow-icon"_L1;
        case QStyle::SP_ArrowDown: return "downarrow-icon"_L1;
        case QStyle::SP_ArrowLeft: return "leftarrow-icon"_L1;
        case QStyle::SP_ArrowRight: return "rightarrow-icon"_L1;
        case QStyle::SP_ArrowBack: return "backward-icon"_L1;
        case QStyle::SP_ArrowForward: return "forward-icon"_L1;
        case QStyle::SP_DirHomeIcon: return "home-icon"_L1;
        case QStyle::SP_LineEditClearButton: return "lineedit-clear-button-icon"_L1;
        default: return ""_L1;
    }
}